

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

bool IsKBIWeakSectorTrack(Track *track,int *weak_offset,int *weak_size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Sector *this;
  Sector *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  const_reference pvVar5;
  byte *pbVar6;
  Data *dataW;
  Sector *sector;
  int i;
  Sector *sectorW;
  int size_code;
  int sectors;
  int *weak_size_local;
  int *weak_offset_local;
  Track *track_local;
  
  iVar2 = Track::size(track);
  if (iVar2 == 3) {
    sectorW._0_4_ = 4;
  }
  else {
    if (iVar2 != 10) {
      return false;
    }
    sectorW._0_4_ = 2;
  }
  this = Track::operator[](track,iVar2 + -1);
  if ((((this->encoding == MFM) && (this->datarate == _250K)) && ((this->header).size == 1)) &&
     ((iVar3 = Sector::data_size(this), 0xff < iVar3 &&
      (bVar1 = Sector::has_baddatacrc(this), bVar1)))) {
    sector._4_4_ = 0;
    while( true ) {
      if (iVar2 + -1 <= sector._4_4_) {
        this_01 = &Sector::data_copy(this,0)->
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_01,0);
        if (*pvVar5 == 'K') {
          pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_01,1)
          ;
          iVar2 = isalpha((uint)*pbVar6);
          if (iVar2 != 0) {
            pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (this_01,2);
            iVar2 = isalpha((uint)*pbVar6);
            if (iVar2 != 0) {
              *weak_offset = 4;
              *weak_size = 4;
              if (opt.debug != 0) {
                util::operator<<((LogHelper *)&util::cout,
                                 (char (*) [32])"detected KBI weak sector track\n");
              }
              return true;
            }
          }
        }
        return false;
      }
      this_00 = Track::operator[](track,sector._4_4_);
      if (((this_00->encoding != MFM) || (this_00->datarate != _250K)) ||
         ((this_00->header).size != (int)sectorW)) break;
      iVar3 = Sector::data_size(this_00);
      iVar4 = Sector::SizeCodeToLength((int)sectorW);
      if (iVar3 < iVar4) {
        return false;
      }
      sector._4_4_ = sector._4_4_ + 1;
    }
    return false;
  }
  return false;
}

Assistant:

bool IsKBIWeakSectorTrack(const Track& track, int& weak_offset, int& weak_size)
{
    auto sectors = track.size();

    // Most titles use the 10-sector version, but some have 3x2K sectors.
    int size_code;
    if (sectors == 3)
        size_code = 4;
    else if (sectors == 10)
        size_code = 2;
    else
        return false;

    // Weak sector is always last on track and 256 bytes
    auto& sectorW = track[sectors - 1];
    if (sectorW.encoding != Encoding::MFM ||
        sectorW.datarate != DataRate::_250K ||
        sectorW.header.size != 1 ||
        sectorW.data_size() < 256 ||
        !sectorW.has_baddatacrc())
    {
        return false;
    }

    // The remaining sector must be the correct type and size code.
    for (int i = 0; i < sectors - 1; ++i)
    {
        auto& sector = track[i];
        if (sector.encoding != Encoding::MFM ||
            sector.datarate != DataRate::_250K ||
            sector.header.size != size_code ||
            sector.data_size() < Sector::SizeCodeToLength(size_code))
        {
            return false;
        }
    }

    auto& dataW = sectorW.data_copy();

    // The first character of the weak sector is 'K', and the next two are alphabetic.
    if (dataW[0] != 'K' ||
        !std::isalpha(static_cast<uint8_t>(dataW[1])) ||
        !std::isalpha(static_cast<uint8_t>(dataW[2])))
    {
        return false;
    }

    // =4 -4 =124 -4 =120
    weak_offset = 4;
    weak_size = 4;

    if (opt.debug) util::cout << "detected KBI weak sector track\n";
    return true;
}